

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.cc
# Opt level: O0

void __thiscall absl::lts_20240722::Mutex::Fer(Mutex *this,PerThreadSynch *w)

{
  long lVar1;
  memory_order mVar2;
  PerThreadSynch *pPVar3;
  ulong uVar4;
  ulong uVar5;
  bool bVar6;
  char *absl_raw_log_internal_basename_3;
  PerThreadSynch *new_h_1;
  PerThreadSynch *h;
  char *absl_raw_log_internal_basename_2;
  PerThreadSynch *new_h;
  intptr_t conflicting;
  intptr_t v;
  char *local_120;
  char *absl_raw_log_internal_basename_1;
  char *local_108;
  char *absl_raw_log_internal_basename;
  int c;
  ScopedDisable disable_rescheduling;
  PerThreadSynch *w_local;
  Mutex *this_local;
  memory_order __b_1;
  memory_order __b;
  
  _c = w;
  base_internal::SchedulingGuard::ScopedDisable::ScopedDisable
            ((ScopedDisable *)((long)&absl_raw_log_internal_basename + 7));
  absl_raw_log_internal_basename._0_4_ = 0;
  if (_c->waitp->cond != (Condition *)0x0) {
    local_108 = "mutex.cc";
    absl::lts_20240722::raw_log_internal::RawLog
              (kFatal,"mutex.cc",0x972,"Check %s failed: %s","w->waitp->cond == nullptr",
               "Mutex::Fer while waiting on Condition");
    __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/absl-src/absl/synchronization/mutex.cc"
                  ,0x972,"void absl::Mutex::Fer(PerThreadSynch *)");
  }
  if (_c->waitp->cv_word != (atomic<long> *)0x0) {
    local_120 = "mutex.cc";
    absl::lts_20240722::raw_log_internal::RawLog
              (kFatal,"mutex.cc",0x974,"Check %s failed: %s","w->waitp->cv_word == nullptr",
               "Mutex::Fer with pending CondVar queueing");
    __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/absl-src/absl/synchronization/mutex.cc"
                  ,0x974,"void absl::Mutex::Fer(PerThreadSynch *)");
  }
  synchronization_internal::KernelTimeout::KernelTimeout((KernelTimeout *)&v);
  (_c->waitp->timeout).rep_ = v;
  while( true ) {
    std::operator&(memory_order_relaxed,__memory_order_mask);
    conflicting = (this->mu_).super___atomic_base<long>._M_i;
    if ((conflicting & ((ulong)(_c->waitp->how != (MuHow)kSharedS) | 8)) == 0) break;
    if ((conflicting & 0x44U) == 0) {
      pPVar3 = Enqueue((PerThreadSynch *)0x0,_c->waitp,conflicting,6);
      if (pPVar3 == (PerThreadSynch *)0x0) {
        absl::lts_20240722::raw_log_internal::RawLog
                  (kFatal,"mutex.cc",0x98c,"Check %s failed: %s","new_h != nullptr","Enqueue failed"
                  );
        __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/absl-src/absl/synchronization/mutex.cc"
                      ,0x98c,"void absl::Mutex::Fer(PerThreadSynch *)");
      }
      LOCK();
      bVar6 = conflicting == (this->mu_).super___atomic_base<long>._M_i;
      if (bVar6) {
        (this->mu_).super___atomic_base<long>._M_i = (ulong)pPVar3 | conflicting & 0xffU | 4;
      }
      UNLOCK();
      if (bVar6) goto LAB_00120575;
    }
    else if ((conflicting & 0x40U) == 0) {
      uVar4 = conflicting | 0x44;
      mVar2 = std::__cmpexch_failure_order(memory_order_seq_cst);
      switch(0x11f88c) {
      default:
        if (mVar2 - memory_order_consume < 2) {
          LOCK();
          uVar5 = (this->mu_).super___atomic_base<long>._M_i;
          bVar6 = conflicting == uVar5;
          if (bVar6) {
            (this->mu_).super___atomic_base<long>._M_i = uVar4;
            uVar5 = conflicting;
          }
          UNLOCK();
          if (!bVar6) {
            conflicting = uVar5;
          }
        }
        else if (mVar2 == memory_order_seq_cst) {
          LOCK();
          uVar5 = (this->mu_).super___atomic_base<long>._M_i;
          bVar6 = conflicting == uVar5;
          if (bVar6) {
            (this->mu_).super___atomic_base<long>._M_i = uVar4;
            uVar5 = conflicting;
          }
          UNLOCK();
          if (!bVar6) {
            conflicting = uVar5;
          }
        }
        else {
          LOCK();
          uVar5 = (this->mu_).super___atomic_base<long>._M_i;
          bVar6 = conflicting == uVar5;
          if (bVar6) {
            (this->mu_).super___atomic_base<long>._M_i = uVar4;
            uVar5 = conflicting;
          }
          UNLOCK();
          if (!bVar6) {
            conflicting = uVar5;
          }
        }
        break;
      case 2:
        if (mVar2 - memory_order_consume < 2) {
          LOCK();
          uVar5 = (this->mu_).super___atomic_base<long>._M_i;
          bVar6 = conflicting == uVar5;
          if (bVar6) {
            (this->mu_).super___atomic_base<long>._M_i = uVar4;
            uVar5 = conflicting;
          }
          UNLOCK();
          if (!bVar6) {
            conflicting = uVar5;
          }
        }
        else if (mVar2 == memory_order_seq_cst) {
          LOCK();
          uVar5 = (this->mu_).super___atomic_base<long>._M_i;
          bVar6 = conflicting == uVar5;
          if (bVar6) {
            (this->mu_).super___atomic_base<long>._M_i = uVar4;
            uVar5 = conflicting;
          }
          UNLOCK();
          if (!bVar6) {
            conflicting = uVar5;
          }
        }
        else {
          LOCK();
          uVar5 = (this->mu_).super___atomic_base<long>._M_i;
          bVar6 = conflicting == uVar5;
          if (bVar6) {
            (this->mu_).super___atomic_base<long>._M_i = uVar4;
            uVar5 = conflicting;
          }
          UNLOCK();
          if (!bVar6) {
            conflicting = uVar5;
          }
        }
        break;
      case 3:
        if (mVar2 - memory_order_consume < 2) {
          LOCK();
          uVar5 = (this->mu_).super___atomic_base<long>._M_i;
          bVar6 = conflicting == uVar5;
          if (bVar6) {
            (this->mu_).super___atomic_base<long>._M_i = uVar4;
            uVar5 = conflicting;
          }
          UNLOCK();
          if (!bVar6) {
            conflicting = uVar5;
          }
        }
        else if (mVar2 == memory_order_seq_cst) {
          LOCK();
          uVar5 = (this->mu_).super___atomic_base<long>._M_i;
          bVar6 = conflicting == uVar5;
          if (bVar6) {
            (this->mu_).super___atomic_base<long>._M_i = uVar4;
            uVar5 = conflicting;
          }
          UNLOCK();
          if (!bVar6) {
            conflicting = uVar5;
          }
        }
        else {
          LOCK();
          uVar5 = (this->mu_).super___atomic_base<long>._M_i;
          bVar6 = conflicting == uVar5;
          if (bVar6) {
            (this->mu_).super___atomic_base<long>._M_i = uVar4;
            uVar5 = conflicting;
          }
          UNLOCK();
          if (!bVar6) {
            conflicting = uVar5;
          }
        }
        break;
      case 4:
        if (mVar2 - memory_order_consume < 2) {
          LOCK();
          uVar5 = (this->mu_).super___atomic_base<long>._M_i;
          bVar6 = conflicting == uVar5;
          if (bVar6) {
            (this->mu_).super___atomic_base<long>._M_i = uVar4;
            uVar5 = conflicting;
          }
          UNLOCK();
          if (!bVar6) {
            conflicting = uVar5;
          }
        }
        else if (mVar2 == memory_order_seq_cst) {
          LOCK();
          uVar5 = (this->mu_).super___atomic_base<long>._M_i;
          bVar6 = conflicting == uVar5;
          if (bVar6) {
            (this->mu_).super___atomic_base<long>._M_i = uVar4;
            uVar5 = conflicting;
          }
          UNLOCK();
          if (!bVar6) {
            conflicting = uVar5;
          }
        }
        else {
          LOCK();
          uVar5 = (this->mu_).super___atomic_base<long>._M_i;
          bVar6 = conflicting == uVar5;
          if (bVar6) {
            (this->mu_).super___atomic_base<long>._M_i = uVar4;
            uVar5 = conflicting;
          }
          UNLOCK();
          if (!bVar6) {
            conflicting = uVar5;
          }
        }
      }
      if (bVar6) {
        pPVar3 = GetPerThreadSynch(conflicting);
        pPVar3 = Enqueue(pPVar3,_c->waitp,conflicting,6);
        if (pPVar3 == (PerThreadSynch *)0x0) {
          absl::lts_20240722::raw_log_internal::RawLog
                    (kFatal,"mutex.cc",0x997,"Check %s failed: %s","new_h != nullptr",
                     "Enqueue failed");
          __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/absl-src/absl/synchronization/mutex.cc"
                        ,0x997,"void absl::Mutex::Fer(PerThreadSynch *)");
        }
        do {
          std::operator&(memory_order_relaxed,__memory_order_mask);
          lVar1 = (this->mu_).super___atomic_base<long>._M_i;
          LOCK();
          bVar6 = lVar1 == (this->mu_).super___atomic_base<long>._M_i;
          if (bVar6) {
            (this->mu_).super___atomic_base<long>._M_i =
                 (ulong)((uint)lVar1 & 0xbb) | (ulong)pPVar3 | 4;
          }
          UNLOCK();
        } while (!bVar6);
        goto LAB_00120575;
      }
    }
    absl_raw_log_internal_basename._0_4_ =
         synchronization_internal::MutexDelay((int)absl_raw_log_internal_basename,1);
  }
  _c->next = (PerThreadSynch *)0x0;
  std::atomic<absl::lts_20240722::base_internal::PerThreadSynch::State>::store
            (&_c->state,kAvailable,memory_order_release);
  IncrementSynchSem(this,_c);
LAB_00120575:
  base_internal::SchedulingGuard::ScopedDisable::~ScopedDisable
            ((ScopedDisable *)((long)&absl_raw_log_internal_basename + 7));
  return;
}

Assistant:

void Mutex::Fer(PerThreadSynch* w) {
  SchedulingGuard::ScopedDisable disable_rescheduling;
  int c = 0;
  ABSL_RAW_CHECK(w->waitp->cond == nullptr,
                 "Mutex::Fer while waiting on Condition");
  ABSL_RAW_CHECK(w->waitp->cv_word == nullptr,
                 "Mutex::Fer with pending CondVar queueing");
  // The CondVar timeout is not relevant for the Mutex wait.
  w->waitp->timeout = {};
  for (;;) {
    intptr_t v = mu_.load(std::memory_order_relaxed);
    // Note: must not queue if the mutex is unlocked (nobody will wake it).
    // For example, we can have only kMuWait (conditional) or maybe
    // kMuWait|kMuWrWait.
    // conflicting != 0 implies that the waking thread cannot currently take
    // the mutex, which in turn implies that someone else has it and can wake
    // us if we queue.
    const intptr_t conflicting =
        kMuWriter | (w->waitp->how == kShared ? 0 : kMuReader);
    if ((v & conflicting) == 0) {
      w->next = nullptr;
      w->state.store(PerThreadSynch::kAvailable, std::memory_order_release);
      IncrementSynchSem(this, w);
      return;
    } else {
      if ((v & (kMuSpin | kMuWait)) == 0) {  // no waiters
        // This thread tries to become the one and only waiter.
        PerThreadSynch* new_h =
            Enqueue(nullptr, w->waitp, v, kMuIsCond | kMuIsFer);
        ABSL_RAW_CHECK(new_h != nullptr,
                       "Enqueue failed");  // we must queue ourselves
        if (mu_.compare_exchange_strong(
                v, reinterpret_cast<intptr_t>(new_h) | (v & kMuLow) | kMuWait,
                std::memory_order_release, std::memory_order_relaxed)) {
          return;
        }
      } else if ((v & kMuSpin) == 0 &&
                 mu_.compare_exchange_strong(v, v | kMuSpin | kMuWait)) {
        PerThreadSynch* h = GetPerThreadSynch(v);
        PerThreadSynch* new_h = Enqueue(h, w->waitp, v, kMuIsCond | kMuIsFer);
        ABSL_RAW_CHECK(new_h != nullptr,
                       "Enqueue failed");  // we must queue ourselves
        do {
          v = mu_.load(std::memory_order_relaxed);
        } while (!mu_.compare_exchange_weak(
            v,
            (v & kMuLow & ~kMuSpin) | kMuWait |
                reinterpret_cast<intptr_t>(new_h),
            std::memory_order_release, std::memory_order_relaxed));
        return;
      }
    }
    c = synchronization_internal::MutexDelay(c, GENTLE);
  }
}